

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

ActionMessage * __thiscall
helics::FilterFederate::processMessage
          (FilterFederate *this,ActionMessage *command,BasicHandleInfo *handle)

{
  atomic<int> *paVar1;
  uint32_t pid;
  pointer ppFVar2;
  FilterCoordinator *pFVar3;
  pointer ppFVar4;
  ulong uVar5;
  pair<helics::ActionMessage_&,_bool> pVar6;
  
  pFVar3 = getFilterCoordinator(this,(InterfaceHandle)(handle->handle).handle.hid);
  if ((pFVar3 != (FilterCoordinator *)0x0) && (pFVar3->hasSourceFilters == true)) {
    ppFVar4 = (pFVar3->sourceFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (pFVar3->sourceFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar4 != ppFVar2) {
      uVar5 = 0;
      do {
        if (((*ppFVar4)->flags & 0x1000) == 0) {
          pVar6 = executeFilter(this,command,*ppFVar4);
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if (command->messageAction == cmd_ignore) {
              return command;
            }
            command->counter = (uint16_t)uVar5;
            if (uVar5 < ((long)(pFVar3->sourceFilters).
                               super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pFVar3->sourceFilters).
                               super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
              ActionMessage::setAction(command,cmd_send_for_filter_return);
              LOCK();
              paVar1 = &this->messageCounter;
              pid = (paVar1->super___atomic_base<int>)._M_i;
              (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
              UNLOCK();
              command->sequenceID = pid;
              generateProcessMarker
                        (this,(GlobalFederateId)(handle->handle).fed_id.gid,pid,
                         (Time)(command->actionTime).internalTimeCode);
              return command;
            }
            ActionMessage::setAction(command,cmd_send_for_filter);
            return command;
          }
          uVar5 = uVar5 + 1;
        }
        ppFVar4 = ppFVar4 + 1;
      } while (ppFVar4 != ppFVar2);
    }
  }
  return command;
}

Assistant:

ActionMessage& FilterFederate::processMessage(ActionMessage& command, const BasicHandleInfo* handle)
{
    auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());
    if (filtFunc == nullptr) {
        return command;
    }
    if (filtFunc->hasSourceFilters) {
        //   for (int ii = 0; ii < static_cast<int> (filtFunc->sourceFilters.size ()); ++ii)
        size_t ii = 0;
        for (auto& filt : filtFunc->sourceFilters) {
            if (checkActionFlag(*filt, disconnected_flag)) {
                continue;
            }
            auto press = executeFilter(command, filt);
            if (!press.second) {
                if (command.action() == CMD_IGNORE) {
                    return command;
                }
                command.counter = static_cast<uint16_t>(ii);
                if (ii < filtFunc->sourceFilters.size() - 1) {
                    command.setAction(CMD_SEND_FOR_FILTER_AND_RETURN);
                    command.sequenceID = messageCounter++;
                    generateProcessMarker(handle->getFederateId(),
                                          command.sequenceID,
                                          command.actionTime);
                } else {
                    command.setAction(CMD_SEND_FOR_FILTER);
                }
                return command;
            }
            ++ii;
        }
    }
    return command;
}